

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LoopContinueLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loopcontinue(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LoopContinueLayerParams *pLVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x271) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x271;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pLVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::LoopContinueLayerParams>(arena);
    (this->layer_).loopcontinue_ = pLVar2;
  }
  return (LoopContinueLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopContinueLayerParams* NeuralNetworkLayer::_internal_mutable_loopcontinue() {
  if (!_internal_has_loopcontinue()) {
    clear_layer();
    set_has_loopcontinue();
    layer_.loopcontinue_ = CreateMaybeMessage< ::CoreML::Specification::LoopContinueLayerParams >(GetArenaForAllocation());
  }
  return layer_.loopcontinue_;
}